

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_set_sig_bytes(png_structrp png_ptr,int num_bytes)

{
  uint local_18;
  uint nb;
  int num_bytes_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    local_18 = num_bytes;
    if (num_bytes < 0) {
      local_18 = 0;
    }
    if (8 < local_18) {
      png_error(png_ptr,"Too many bytes for PNG signature");
    }
    png_ptr->sig_bytes = (png_byte)local_18;
  }
  return;
}

Assistant:

void PNGAPI
png_set_sig_bytes(png_structrp png_ptr, int num_bytes)
{
   unsigned int nb = (unsigned int)num_bytes;

   png_debug(1, "in png_set_sig_bytes");

   if (png_ptr == NULL)
      return;

   if (num_bytes < 0)
      nb = 0;

   if (nb > 8)
      png_error(png_ptr, "Too many bytes for PNG signature");

   png_ptr->sig_bytes = (png_byte)nb;
}